

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12.c
# Opt level: O2

int mbedtls_pkcs12_pbe_sha1_rc4_128
              (mbedtls_asn1_buf *pbe_params,int mode,uchar *pwd,size_t pwdlen,uchar *data,size_t len
              ,uchar *output)

{
  int iVar1;
  uchar key [16];
  mbedtls_arc4_context ctx;
  
  mbedtls_arc4_init(&ctx);
  iVar1 = pkcs12_pbe_derive_key_iv(pbe_params,MBEDTLS_MD_SHA1,pwd,pwdlen,key,0x10,(uchar *)0x0,0);
  if (iVar1 == 0) {
    mbedtls_arc4_setup(&ctx,key,0x10);
    iVar1 = mbedtls_arc4_crypt(&ctx,len,data,output);
    mbedtls_zeroize(key,0x10);
    mbedtls_arc4_free(&ctx);
  }
  return iVar1;
}

Assistant:

int mbedtls_pkcs12_pbe_sha1_rc4_128( mbedtls_asn1_buf *pbe_params, int mode,
                             const unsigned char *pwd,  size_t pwdlen,
                             const unsigned char *data, size_t len,
                             unsigned char *output )
{
#if !defined(MBEDTLS_ARC4_C)
    ((void) pbe_params);
    ((void) mode);
    ((void) pwd);
    ((void) pwdlen);
    ((void) data);
    ((void) len);
    ((void) output);
    return( MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE );
#else
    int ret;
    unsigned char key[16];
    mbedtls_arc4_context ctx;
    ((void) mode);

    mbedtls_arc4_init( &ctx );

    if( ( ret = pkcs12_pbe_derive_key_iv( pbe_params, MBEDTLS_MD_SHA1,
                                          pwd, pwdlen,
                                          key, 16, NULL, 0 ) ) != 0 )
    {
        return( ret );
    }

    mbedtls_arc4_setup( &ctx, key, 16 );
    if( ( ret = mbedtls_arc4_crypt( &ctx, len, data, output ) ) != 0 )
        goto exit;

exit:
    mbedtls_zeroize( key, sizeof( key ) );
    mbedtls_arc4_free( &ctx );

    return( ret );
#endif /* MBEDTLS_ARC4_C */
}